

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_hash_set_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_IfContains_Test::
~ParallelFlatHashSet_IfContains_Test(ParallelFlatHashSet_IfContains_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, IfContains) {
    // ----------------
    // test if_contains
    // ----------------
    using Set = phmap::THIS_HASH_SET<Entry>;
    Set m = { {1, 7}, {2, 9} };
    const Set& const_m(m);
    
    auto val = 0; 
    auto get_value = [&val](const Set::value_type& v) { val = v.value; };
    EXPECT_TRUE(const_m.if_contains(Entry{2}, get_value));
    EXPECT_EQ(val, 9);

    EXPECT_FALSE(m.if_contains(Entry{3}, get_value));
}